

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall
dgMeshEffect::GetFaces(dgMeshEffect *this,HaI32 *facesIndex,HaI32 *materials,void **faceNodeList)

{
  dgEdge *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  dgRedBackNode *pdVar4;
  HaI32 HVar5;
  dgTreeNode *pdVar6;
  int iVar7;
  int iVar8;
  dgEdge *info;
  long lVar9;
  Iterator local_40;
  
  local_40.m_tree = (dgTree<dgEdge,_long> *)this;
  HVar5 = dgPolyhedra::IncLRU(&this->super_dgPolyhedra);
  local_40.m_ptr = &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this)->super_dgRedBackNode
  ;
  iVar8 = 0;
  iVar7 = 0;
  while (pdVar4 = local_40.m_ptr, (dgTreeNode *)local_40.m_ptr != (dgTreeNode *)0x0) {
    if ((((dgEdge *)((long)local_40.m_ptr + 0x28))->m_mark != HVar5) &&
       (-1 < ((dgEdge *)((long)local_40.m_ptr + 0x28))->m_incidentFace)) {
      pdVar1 = (dgEdge *)((long)local_40.m_ptr + 0x28);
      lVar9 = 0;
      info = pdVar1;
      do {
        pdVar6 = dgTree<dgEdge,_long>::GetNodeFromInfo((dgTree<dgEdge,_long> *)this,info);
        faceNodeList[iVar8 + lVar9] = pdVar6;
        info->m_mark = HVar5;
        lVar9 = lVar9 + 1;
        info = info->m_next;
      } while (info != pdVar1);
      iVar8 = iVar8 + (int)lVar9;
      facesIndex[iVar7] = (int)lVar9;
      dVar2 = (double)this->m_attib[(int)((dgEdge *)((long)pdVar4 + 0x28))->m_userData].m_material;
      auVar3 = vcvtdq2pd_avx(ZEXT416((uint)(int)dVar2));
      materials[iVar7] = (int)dVar2 - (uint)(dVar2 < auVar3._0_8_);
      iVar7 = iVar7 + 1;
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_40,0);
  }
  return;
}

Assistant:

void dgMeshEffect::GetFaces (hacd::HaI32* const facesIndex, hacd::HaI32* const materials, void** const faceNodeList) const
{
	Iterator iter (*this);

	hacd::HaI32 faces = 0;
	hacd::HaI32 indexCount = 0;
	hacd::HaI32 mark = IncLRU();
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_mark == mark) {
			continue;
		}

		if (edge->m_incidentFace < 0) {
			continue;
		}

		hacd::HaI32 faceCount = 0;
		dgEdge* ptr = edge;
		do {
//			indexList[indexCount] = hacd::HaI32 (ptr->m_userData);
			faceNodeList[indexCount] = GetNodeFromInfo (*ptr);
			indexCount ++;
			faceCount ++;
			ptr->m_mark = mark;
			ptr = ptr->m_next;
		} while (ptr != edge);

		facesIndex[faces] = faceCount;
		materials[faces] = dgFastInt(m_attib[hacd::HaI32 (edge->m_userData)].m_material);
		faces ++;
	}
}